

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getFirstLeak(MemoryLeakDetectorTable *this,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *pMVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 + 8 == 0x250) {
      return (MemoryLeakDetectorNode *)0x0;
    }
    pMVar1 = MemoryLeakDetectorList::getFirstLeak
                       ((MemoryLeakDetectorList *)((long)&this->table_[0].head_ + lVar2),period);
    lVar2 = lVar2 + 8;
  } while (pMVar1 == (MemoryLeakDetectorNode *)0x0);
  return pMVar1;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getFirstLeak(MemLeakPeriod period)
{
    for (int i = 0; i < hash_prime; i++) {
        MemoryLeakDetectorNode* node = table_[i].getFirstLeak(period);
        if (node) return node;
    }
    return NULLPTR;
}